

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O1

double sat_solver3_progress(sat_solver3 *s)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = s->size;
  if (iVar1 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar3 = (double)iVar1;
    dVar5 = 0.0;
    lVar2 = 0;
    do {
      if (s->assigns[lVar2] != '\x03') {
        dVar4 = pow(1.0 / dVar3,(double)s->levels[lVar2]);
        dVar5 = dVar5 + dVar4;
      }
      lVar2 = lVar2 + 1;
      iVar1 = s->size;
    } while (lVar2 < iVar1);
  }
  return dVar5 / (double)iVar1;
}

Assistant:

static double sat_solver3_progress(sat_solver3* s)
{
    int     i;
    double  progress = 0;
    double  F        = 1.0 / s->size;
    for (i = 0; i < s->size; i++)
        if (var_value(s, i) != varX)
            progress += pow(F, var_level(s, i));
    return progress / s->size;
}